

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

TheoryTerm * __thiscall
Potassco::TheoryData::addTerm(TheoryData *this,Id_t termId,Id_t funcId,IdSpan *args)

{
  ulong uVar1;
  Id_t *pIVar2;
  TheoryTerm *pTVar3;
  
  pIVar2 = (Id_t *)operator_new(args->size * 4 + 8);
  *pIVar2 = funcId;
  uVar1 = args->size;
  pIVar2[1] = (Id_t)uVar1;
  memcpy(pIVar2 + 2,args->first,(uVar1 & 0xffffffff) << 2);
  if (((ulong)pIVar2 & 3) == 0) {
    pTVar3 = setTerm(this,termId);
    pTVar3->data_ = (ulong)pIVar2 | 2;
    return pTVar3;
  }
  fail(-2,"uint64_t Potassco::TheoryTerm::assertPtr(const void *) const",0x46,"(data & 3u) == 0u",
       "Invalid pointer alignment",0);
}

Assistant:

const TheoryTerm& TheoryData::addTerm(Id_t termId, Id_t funcId, const IdSpan& args) {
	return setTerm(termId) = TheoryTerm(FuncData::newFunc(static_cast<int32_t>(funcId), args));
}